

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O3

int Datetime::length(string *format)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  
  sVar2 = format->_M_string_length;
  if (sVar2 == 0) {
    iVar6 = 0;
  }
  else {
    pcVar3 = (format->_M_dataplus)._M_p;
    sVar7 = 0;
    iVar6 = 0;
    do {
      bVar1 = pcVar3[sVar7];
      iVar4 = 2;
      switch(bVar1) {
      case 0x41:
      case 0x42:
        iVar4 = 10;
        break;
      case 0x44:
      case 0x48:
      case 0x4d:
      case 0x4e:
      case 0x53:
      case 0x56:
        break;
      case 0x4a:
switchD_00110023_caseD_4a:
        iVar4 = 3;
        break;
      case 0x59:
        iVar4 = 4;
        break;
      default:
        uVar5 = bVar1 - 0x61;
        if (uVar5 < 0x19) {
          if ((0x1243088U >> (uVar5 & 0x1f) & 1) != 0) break;
          if ((0x203U >> (uVar5 & 0x1f) & 1) != 0) goto switchD_00110023_caseD_4a;
        }
      case 0x43:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x49:
      case 0x4b:
      case 0x4c:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x54:
      case 0x55:
      case 0x57:
      case 0x58:
        iVar4 = mk_wcwidth((int)(char)bVar1);
      }
      iVar6 = iVar6 + iVar4;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  return iVar6;
}

Assistant:

bool Datetime::parse_time_off_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_time_ext (pig, false) &&
      parse_off_ext (pig))
  {
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}